

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CMU462::Collada::ColladaWriter::writeVisualScenes(ofstream *out,Scene *scene)

{
  ostream *poVar1;
  long lVar2;
  _Base_ptr p_Var3;
  int iVar4;
  int iVar5;
  
  poVar1 = std::operator<<((ostream *)out,"   <library_visual_scenes>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"      <visual_scene id=\"ScottyScene\">");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar5 = 0;
  iVar4 = 0;
  for (p_Var3 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (*(long *)(p_Var3 + 1) != 0) {
      lVar2 = __dynamic_cast(*(long *)(p_Var3 + 1),&DynamicScene::SceneObject::typeinfo,
                             &DynamicScene::Mesh::typeinfo,0);
      if (lVar2 != 0) {
        iVar4 = iVar4 + 1;
        iVar5 = iVar5 + 1;
        poVar1 = std::operator<<((ostream *)out,"         <node id=\"N");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
        poVar1 = std::operator<<(poVar1,"\" name=\"Node");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar5);
        poVar1 = std::operator<<(poVar1,"\">");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)out,"            <instance_geometry url=\"#M");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
        poVar1 = std::operator<<(poVar1,"\">");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)out,"            </instance_geometry>");
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)out,"         </node>");
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
  }
  poVar1 = std::operator<<((ostream *)out,"      </visual_scene>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   </library_visual_scenes>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   <scene>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"      <instance_visual_scene url=\"#ScottyScene\"/>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)out,"   </scene>");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void ColladaWriter::writeVisualScenes( ofstream& out, DynamicScene::Scene& scene )
{
   out << "   <library_visual_scenes>" << endl;
   out << "      <visual_scene id=\"ScottyScene\">" << endl;

   int nMeshes = 0;
   int nNodes = 0;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         nNodes++;
         out << "         <node id=\"N" << nNodes << "\" name=\"Node" << nNodes << "\">" << endl;
         out << "            <instance_geometry url=\"#M" << nMeshes << "\">" << endl;
         out << "            </instance_geometry>" << endl;
         out << "         </node>" << endl;
      }
   }

   out << "      </visual_scene>" << endl;
   out << "   </library_visual_scenes>" << endl;

   out << "   <scene>" << endl;
   out << "      <instance_visual_scene url=\"#ScottyScene\"/>" << endl;
   out << "   </scene>" << endl;
}